

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Question * __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::erase
          (Question *__return_storage_ptr__,
          ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint id,Question *entry)

{
  Question *pQVar1;
  Question *pQVar2;
  uint *puVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  bool bVar6;
  undefined8 uVar7;
  uint local_5c;
  undefined1 local_58 [42];
  bool local_2e;
  Fault local_20;
  
  local_5c = id;
  if ((int)id < 0) {
    kj::
    Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
    ::find<0ul,unsigned_int&>
              ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
                *)local_58,(uint *)&this->highSlots);
    if ((Entry *)local_58._0_8_ == (Entry *)0x0) {
      local_20.exception = (Exception *)0x0;
      local_58._0_8_ = 0;
      local_58._8_8_ = (uint *)0x0;
      kj::_::Debug::Fault::init
                (&local_20,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                );
      kj::_::Debug::Fault::fatal(&local_20);
    }
    kj::
    Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>_>
    ::release((Entry *)local_58,&(this->highSlots).table,(Entry *)local_58._0_8_);
    (__return_storage_ptr__->paramExports).ptr = (uint *)local_58._8_8_;
    (__return_storage_ptr__->paramExports).size_ = local_58._16_8_;
    (__return_storage_ptr__->paramExports).disposer = (ArrayDisposer *)local_58._24_8_;
    (__return_storage_ptr__->selfRef).ptr = (QuestionRef *)local_58._32_8_;
    __return_storage_ptr__->skipFinish = local_2e;
    __return_storage_ptr__->isAwaitingReturn = (bool)local_58[0x28];
    __return_storage_ptr__->isTailCall = (bool)local_58[0x29];
  }
  else {
    pQVar1 = (this->slots).builder.ptr;
    (__return_storage_ptr__->paramExports).ptr = pQVar1[id].paramExports.ptr;
    (__return_storage_ptr__->paramExports).size_ = pQVar1[id].paramExports.size_;
    (__return_storage_ptr__->paramExports).disposer = pQVar1[id].paramExports.disposer;
    pQVar1[id].paramExports.ptr = (uint *)0x0;
    pQVar1[id].paramExports.size_ = 0;
    (__return_storage_ptr__->selfRef).ptr = pQVar1[id].selfRef.ptr;
    pQVar1[id].selfRef.ptr = (QuestionRef *)0x0;
    __return_storage_ptr__->skipFinish = pQVar1[id].skipFinish;
    bVar6 = pQVar1[id].isTailCall;
    __return_storage_ptr__->isAwaitingReturn = pQVar1[id].isAwaitingReturn;
    __return_storage_ptr__->isTailCall = bVar6;
    local_58._32_8_ = (QuestionRef *)0x0;
    local_58._16_8_ = (ArrayDisposer *)0x0;
    local_58._24_8_ = (QuestionRef *)0x0;
    local_58._0_8_ = (uint *)0x0;
    local_58._8_8_ = (uint *)0x0;
    pQVar2 = (this->slots).builder.ptr;
    pQVar1 = pQVar2 + id;
    puVar3 = pQVar2[id].paramExports.ptr;
    if (puVar3 != (uint *)0x0) {
      sVar4 = (pQVar1->paramExports).size_;
      pAVar5 = (pQVar1->paramExports).disposer;
      (pQVar1->paramExports).ptr = (uint *)0x0;
      (pQVar1->paramExports).size_ = 0;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,puVar3,4,sVar4,sVar4,0);
    }
    uVar7 = local_58._32_8_;
    (pQVar1->paramExports).ptr = (uint *)local_58._0_8_;
    (pQVar1->paramExports).size_ = local_58._8_8_;
    (pQVar1->paramExports).disposer = (ArrayDisposer *)local_58._16_8_;
    (pQVar1->selfRef).ptr = (QuestionRef *)local_58._24_8_;
    pQVar1->skipFinish = local_58[0x22];
    pQVar1->isAwaitingReturn = (bool)local_58[0x20];
    pQVar1->isTailCall = (bool)local_58[0x21];
    local_58._24_8_ = (ArrayDisposer *)0x0;
    local_58._8_8_ = (uint *)0x0;
    local_58._0_8_ = 0;
    local_58._32_8_ = uVar7;
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::push(&this->freeIds,&local_5c);
  }
  return __return_storage_ptr__;
}

Assistant:

T erase(Id id, T& entry) {
    // Remove an entry from the table and return it.  We return it so that the caller can be
    // careful to release it (possibly invoking arbitrary destructors) at a time that makes sense.
    // `entry` is a reference to the entry being released -- we require this in order to prove
    // that the caller has already done a find() to check that this entry exists.  We can't check
    // ourselves because the caller may have nullified the entry in the meantime.

    if (isHigh(id)) {
      auto& slot = KJ_REQUIRE_NONNULL(highSlots.findEntry(id));
      return highSlots.release(slot).value;
    } else {
      KJ_DREQUIRE(&entry == &slots[id]);
      T toRelease = kj::mv(slots[id]);
      slots[id] = T();
      freeIds.push(id);
      return toRelease;
    }
  }